

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scene_curves.cpp
# Opt level: O3

BBox3fa * __thiscall
embree::avx::
CurveGeometryISA<(embree::Geometry::GType)1,_embree::avx::HermiteCurveGeometryInterface,_embree::HermiteCurveT>
::vbounds(BBox3fa *__return_storage_ptr__,
         CurveGeometryISA<(embree::Geometry::GType)1,_embree::avx::HermiteCurveGeometryInterface,_embree::HermiteCurveT>
         *this,Vec3fa *ofs,float scale,float r_scale0,LinearSpace3fa *space,size_t i,size_t itime)

{
  float *pfVar1;
  uint uVar2;
  BufferView<embree::Vec3fx> *pBVar3;
  char *pcVar4;
  size_t sVar5;
  char *pcVar6;
  undefined1 auVar7 [32];
  undefined1 auVar8 [32];
  undefined1 auVar9 [32];
  undefined1 auVar10 [16];
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar11;
  undefined1 auVar12 [32];
  undefined1 auVar13 [32];
  undefined1 auVar14 [32];
  undefined1 auVar15 [12];
  undefined1 auVar16 [32];
  undefined1 auVar17 [32];
  undefined1 auVar18 [32];
  long lVar19;
  long lVar20;
  long lVar21;
  long lVar22;
  undefined1 auVar24 [16];
  float fVar23;
  undefined1 auVar25 [16];
  float fVar31;
  float fVar35;
  undefined1 auVar27 [32];
  undefined1 auVar26 [16];
  float fVar29;
  float fVar30;
  float fVar32;
  float fVar33;
  float fVar34;
  undefined1 in_register_00001204 [60];
  undefined1 auVar28 [64];
  float fVar36;
  float fVar37;
  float fVar41;
  float fVar43;
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  float fVar42;
  float fVar44;
  float fVar45;
  float fVar46;
  float fVar47;
  float fVar48;
  float fVar49;
  float fVar50;
  float fVar51;
  float fVar52;
  float fVar53;
  float fVar54;
  undefined1 auVar40 [32];
  undefined1 auVar55 [16];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  float fVar59;
  float fVar61;
  float fVar62;
  undefined1 auVar60 [16];
  float fVar63;
  float fVar64;
  float fVar65;
  float fVar69;
  float fVar71;
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  float fVar70;
  float fVar72;
  float fVar73;
  float fVar74;
  undefined1 auVar68 [32];
  float fVar75;
  float fVar77;
  float fVar78;
  undefined1 auVar76 [16];
  float fVar79;
  float fVar80;
  float fVar82;
  float fVar83;
  float fVar84;
  undefined1 auVar81 [32];
  float fVar85;
  float fVar86;
  float fVar88;
  float fVar89;
  float fVar90;
  float fVar91;
  undefined1 auVar87 [16];
  float fVar92;
  float fVar93;
  float fVar94;
  float fVar96;
  float fVar97;
  float fVar98;
  float fVar99;
  float fVar100;
  undefined1 auVar95 [32];
  float fVar102;
  undefined1 auVar101 [32];
  float fVar103;
  float fVar104;
  float fVar107;
  float fVar108;
  float fVar109;
  float fVar110;
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  float fVar111;
  float fVar112;
  float fVar113;
  float fVar114;
  float fVar115;
  float fVar116;
  float fVar117;
  float fVar119;
  float fVar120;
  float fVar121;
  float fVar122;
  float fVar123;
  undefined1 auVar118 [32];
  float fVar124;
  float fVar126;
  float fVar127;
  float fVar128;
  undefined1 auVar125 [32];
  float fVar129;
  float fVar130;
  float fVar131;
  undefined1 local_178 [8];
  float fStack_170;
  float fStack_16c;
  float fStack_168;
  float fStack_164;
  float fStack_160;
  float fStack_15c;
  
  auVar28._4_60_ = in_register_00001204;
  auVar28._0_4_ = scale;
  fVar29 = scale * r_scale0;
  pBVar3 = (this->super_HermiteCurveGeometryInterface<embree::HermiteCurveT>).super_CurveGeometry.
           vertices.items;
  uVar2 = *(uint *)(*(long *)&(this->super_HermiteCurveGeometryInterface<embree::HermiteCurveT>).
                              super_CurveGeometry.super_Geometry.field_0x58 +
                   i * *(long *)&(this->super_HermiteCurveGeometryInterface<embree::HermiteCurveT>).
                                 super_CurveGeometry.field_0x68);
  pcVar4 = pBVar3[itime].super_RawBufferView.ptr_ofs;
  sVar5 = pBVar3[itime].super_RawBufferView.stride;
  lVar19 = sVar5 * uVar2;
  lVar22 = sVar5 * (uVar2 + 1);
  pBVar3 = (this->super_HermiteCurveGeometryInterface<embree::HermiteCurveT>).super_CurveGeometry.
           tangents.items;
  pcVar6 = pBVar3[itime].super_RawBufferView.ptr_ofs;
  sVar5 = pBVar3[itime].super_RawBufferView.stride;
  lVar20 = uVar2 * sVar5;
  lVar21 = sVar5 * (uVar2 + 1);
  auVar10 = vsubps_avx(*(undefined1 (*) [16])(pcVar4 + lVar19),(undefined1  [16])ofs->field_0);
  auVar55 = vshufps_avx(auVar28._0_16_,auVar28._0_16_,0);
  fVar46 = auVar55._0_4_;
  auVar24._0_4_ = fVar46 * auVar10._0_4_;
  fVar47 = auVar55._4_4_;
  auVar24._4_4_ = fVar47 * auVar10._4_4_;
  fVar48 = auVar55._8_4_;
  auVar24._8_4_ = fVar48 * auVar10._8_4_;
  fVar49 = auVar55._12_4_;
  auVar24._12_4_ = fVar49 * auVar10._12_4_;
  auVar55 = vshufps_avx(auVar24,auVar24,0);
  auVar10 = vshufps_avx(auVar24,auVar24,0x55);
  auVar24 = vshufps_avx(auVar24,auVar24,0xaa);
  fVar31 = (space->vx).field_0.m128[0];
  fVar32 = (space->vx).field_0.m128[1];
  fVar33 = (space->vx).field_0.m128[2];
  fVar34 = (space->vx).field_0.m128[3];
  fVar35 = (space->vy).field_0.m128[0];
  fVar36 = (space->vy).field_0.m128[1];
  fVar37 = (space->vy).field_0.m128[2];
  fVar41 = (space->vy).field_0.m128[3];
  fVar42 = (space->vz).field_0.m128[0];
  fVar43 = (space->vz).field_0.m128[1];
  fVar44 = (space->vz).field_0.m128[2];
  fVar45 = (space->vz).field_0.m128[3];
  fVar23 = (this->super_HermiteCurveGeometryInterface<embree::HermiteCurveT>).super_CurveGeometry.
           maxRadiusScale;
  auVar38._0_4_ = auVar55._0_4_ * fVar31 + auVar10._0_4_ * fVar35 + fVar42 * auVar24._0_4_;
  auVar38._4_4_ = auVar55._4_4_ * fVar32 + auVar10._4_4_ * fVar36 + fVar43 * auVar24._4_4_;
  auVar38._8_4_ = auVar55._8_4_ * fVar33 + auVar10._8_4_ * fVar37 + fVar44 * auVar24._8_4_;
  auVar38._12_4_ = auVar55._12_4_ * fVar34 + auVar10._12_4_ * fVar41 + fVar45 * auVar24._12_4_;
  auVar25 = ZEXT416((uint)(fVar23 * *(float *)(pcVar4 + lVar19 + 0xc) * fVar29));
  auVar55 = vinsertps_avx(auVar38,auVar25,0x30);
  auVar10 = vsubps_avx(*(undefined1 (*) [16])(pcVar4 + lVar22),(undefined1  [16])ofs->field_0);
  auVar39._0_4_ = fVar46 * auVar10._0_4_;
  auVar39._4_4_ = fVar47 * auVar10._4_4_;
  auVar39._8_4_ = fVar48 * auVar10._8_4_;
  auVar39._12_4_ = fVar49 * auVar10._12_4_;
  auVar10 = vshufps_avx(auVar39,auVar39,0);
  auVar24 = vshufps_avx(auVar39,auVar39,0x55);
  auVar39 = vshufps_avx(auVar39,auVar39,0xaa);
  auVar87._0_4_ = auVar10._0_4_ * fVar31 + fVar35 * auVar24._0_4_ + fVar42 * auVar39._0_4_;
  auVar87._4_4_ = auVar10._4_4_ * fVar32 + fVar36 * auVar24._4_4_ + fVar43 * auVar39._4_4_;
  auVar87._8_4_ = auVar10._8_4_ * fVar33 + fVar37 * auVar24._8_4_ + fVar44 * auVar39._8_4_;
  auVar87._12_4_ = auVar10._12_4_ * fVar34 + fVar41 * auVar24._12_4_ + fVar45 * auVar39._12_4_;
  fVar30 = fVar29 * fVar23 * *(float *)(pcVar4 + lVar22 + 0xc);
  auVar10 = vinsertps_avx(auVar87,ZEXT416((uint)fVar30),0x30);
  pfVar1 = (float *)(pcVar6 + lVar20);
  auVar105._0_4_ = fVar46 * *pfVar1;
  auVar105._4_4_ = fVar47 * pfVar1[1];
  auVar105._8_4_ = fVar48 * pfVar1[2];
  auVar105._12_4_ = fVar49 * pfVar1[3];
  auVar24 = vshufps_avx(auVar105,auVar105,0);
  auVar39 = vshufps_avx(auVar105,auVar105,0x55);
  auVar26 = vshufps_avx(auVar105,auVar105,0xaa);
  auVar106._0_4_ = auVar24._0_4_ * fVar31 + auVar26._0_4_ * fVar42 + auVar39._0_4_ * fVar35;
  auVar106._4_4_ = auVar24._4_4_ * fVar32 + auVar26._4_4_ * fVar43 + auVar39._4_4_ * fVar36;
  auVar106._8_4_ = auVar24._8_4_ * fVar33 + auVar26._8_4_ * fVar44 + auVar39._8_4_ * fVar37;
  auVar106._12_4_ = auVar24._12_4_ * fVar34 + auVar26._12_4_ * fVar45 + auVar39._12_4_ * fVar41;
  pfVar1 = (float *)(pcVar6 + lVar21);
  auVar76._0_4_ = fVar46 * *pfVar1;
  auVar76._4_4_ = fVar47 * pfVar1[1];
  auVar76._8_4_ = fVar48 * pfVar1[2];
  auVar76._12_4_ = fVar49 * pfVar1[3];
  auVar24 = vinsertps_avx(auVar106,ZEXT416((uint)(fVar23 * *(float *)(pcVar6 + lVar20 + 0xc) *
                                                 fVar29)),0x30);
  auVar39 = vshufps_avx(auVar76,auVar76,0);
  auVar26 = vshufps_avx(auVar76,auVar76,0x55);
  auVar67 = vshufps_avx(auVar76,auVar76,0xaa);
  auVar66._0_4_ = auVar39._0_4_ * fVar31 + fVar42 * auVar67._0_4_ + auVar26._0_4_ * fVar35;
  auVar66._4_4_ = auVar39._4_4_ * fVar32 + fVar43 * auVar67._4_4_ + auVar26._4_4_ * fVar36;
  auVar66._8_4_ = auVar39._8_4_ * fVar33 + fVar44 * auVar67._8_4_ + auVar26._8_4_ * fVar37;
  auVar66._12_4_ = auVar39._12_4_ * fVar34 + fVar45 * auVar67._12_4_ + auVar26._12_4_ * fVar41;
  auVar39 = vinsertps_avx(auVar66,ZEXT416((uint)(fVar29 * fVar23 * *(float *)(pcVar6 + lVar21 + 0xc)
                                                )),0x30);
  auVar60._0_4_ = auVar55._0_4_ + auVar24._0_4_ * 0.33333334;
  auVar60._4_4_ = auVar55._4_4_ + auVar24._4_4_ * 0.33333334;
  auVar60._8_4_ = auVar55._8_4_ + auVar24._8_4_ * 0.33333334;
  auVar60._12_4_ = auVar55._12_4_ + auVar24._12_4_ * 0.33333334;
  auVar55._0_4_ = auVar39._0_4_ * 0.33333334;
  auVar55._4_4_ = auVar39._4_4_ * 0.33333334;
  auVar55._8_4_ = auVar39._8_4_ * 0.33333334;
  auVar55._12_4_ = auVar39._12_4_ * 0.33333334;
  auVar66 = vsubps_avx(auVar10,auVar55);
  auVar55 = vshufps_avx(auVar66,auVar66,0);
  auVar10 = vshufps_avx(auVar66,auVar66,0x55);
  auVar24 = vshufps_avx(auVar66,auVar66,0xaa);
  auVar39 = vshufps_avx(auVar87,auVar87,0);
  auVar26 = vshufps_avx(auVar87,auVar87,0x55);
  auVar67 = vshufps_avx(auVar87,auVar87,0xaa);
  fVar75 = auVar39._0_4_;
  fVar77 = auVar39._4_4_;
  fVar78 = auVar39._8_4_;
  fVar79 = auVar39._12_4_;
  fVar80 = auVar26._0_4_;
  fVar82 = auVar26._4_4_;
  fVar83 = auVar26._8_4_;
  fVar84 = auVar26._12_4_;
  fVar103 = auVar55._0_4_;
  fVar107 = auVar55._4_4_;
  fVar109 = auVar55._8_4_;
  fVar111 = auVar55._12_4_;
  fVar93 = auVar10._0_4_;
  fVar96 = auVar10._4_4_;
  fVar98 = auVar10._8_4_;
  fVar112 = auVar67._0_4_;
  fVar113 = auVar67._4_4_;
  fVar114 = auVar67._8_4_;
  fVar115 = auVar67._12_4_;
  fVar116 = auVar24._0_4_;
  fVar119 = auVar24._4_4_;
  fVar121 = auVar24._8_4_;
  auVar55 = vshufps_avx(auVar66,auVar66,0xff);
  auVar39 = vshufps_avx(ZEXT416((uint)fVar30),ZEXT416((uint)fVar30),0);
  fVar129 = auVar39._0_4_;
  fVar130 = auVar39._4_4_;
  fVar131 = auVar39._8_4_;
  fVar85 = auVar55._0_4_;
  fVar88 = auVar55._4_4_;
  fVar90 = auVar55._8_4_;
  auVar26 = vshufps_avx(auVar60,auVar60,0);
  fVar64 = auVar26._0_4_;
  fVar69 = auVar26._4_4_;
  fVar71 = auVar26._8_4_;
  fVar73 = auVar26._12_4_;
  auVar26 = vshufps_avx(auVar60,auVar60,0x55);
  fVar104 = auVar26._0_4_;
  fVar108 = auVar26._4_4_;
  fVar110 = auVar26._8_4_;
  auVar67 = vshufps_avx(auVar60,auVar60,0xaa);
  fVar117 = auVar67._0_4_;
  fVar120 = auVar67._4_4_;
  fVar122 = auVar67._8_4_;
  fVar123 = auVar67._12_4_;
  fStack_15c = fVar111 + 0.0 + 0.0;
  auVar67 = vshufps_avx(auVar60,auVar60,0xff);
  fVar124 = auVar67._0_4_;
  fVar126 = auVar67._4_4_;
  fVar127 = auVar67._8_4_;
  fVar128 = auVar67._12_4_;
  fVar102 = (float)bezier_basis0._1660_4_ + (float)bezier_basis0._2816_4_ + 0.0;
  auVar67 = vshufps_avx(auVar38,auVar38,0);
  fVar94 = auVar67._0_4_;
  fVar97 = auVar67._4_4_;
  fVar99 = auVar67._8_4_;
  fVar100 = auVar67._12_4_;
  fVar36 = fVar94 * (float)bezier_basis0._476_4_ +
           fVar64 * (float)bezier_basis0._1632_4_ +
           fVar103 * (float)bezier_basis0._2788_4_ + fVar75 * (float)bezier_basis0._3944_4_;
  fVar41 = fVar97 * (float)bezier_basis0._480_4_ +
           fVar69 * (float)bezier_basis0._1636_4_ +
           fVar107 * (float)bezier_basis0._2792_4_ + fVar77 * (float)bezier_basis0._3948_4_;
  fVar43 = fVar99 * (float)bezier_basis0._484_4_ +
           fVar71 * (float)bezier_basis0._1640_4_ +
           fVar109 * (float)bezier_basis0._2796_4_ + fVar78 * (float)bezier_basis0._3952_4_;
  fVar45 = fVar100 * (float)bezier_basis0._488_4_ +
           fVar73 * (float)bezier_basis0._1644_4_ +
           fVar111 * (float)bezier_basis0._2800_4_ + fVar79 * (float)bezier_basis0._3956_4_;
  fVar47 = fVar94 * (float)bezier_basis0._492_4_ +
           fVar64 * (float)bezier_basis0._1648_4_ +
           fVar103 * (float)bezier_basis0._2804_4_ + fVar75 * (float)bezier_basis0._3960_4_;
  fVar49 = fVar97 * (float)bezier_basis0._496_4_ +
           fVar69 * (float)bezier_basis0._1652_4_ +
           fVar107 * (float)bezier_basis0._2808_4_ + fVar77 * (float)bezier_basis0._3964_4_;
  fVar51 = fVar99 * (float)bezier_basis0._500_4_ +
           fVar71 * (float)bezier_basis0._1656_4_ +
           fVar109 * (float)bezier_basis0._2812_4_ + fVar78 * (float)bezier_basis0._3968_4_;
  fVar53 = fVar73 + fVar79 + 0.0 + 0.0;
  auVar67 = vshufps_avx(auVar38,auVar38,0x55);
  fVar86 = auVar67._0_4_;
  fVar89 = auVar67._4_4_;
  fVar91 = auVar67._8_4_;
  fVar92 = auVar67._12_4_;
  fVar37 = fVar86 * (float)bezier_basis0._476_4_ +
           fVar104 * (float)bezier_basis0._1632_4_ +
           fVar93 * (float)bezier_basis0._2788_4_ + fVar80 * (float)bezier_basis0._3944_4_;
  fVar42 = fVar89 * (float)bezier_basis0._480_4_ +
           fVar108 * (float)bezier_basis0._1636_4_ +
           fVar96 * (float)bezier_basis0._2792_4_ + fVar82 * (float)bezier_basis0._3948_4_;
  fVar44 = fVar91 * (float)bezier_basis0._484_4_ +
           fVar110 * (float)bezier_basis0._1640_4_ +
           fVar98 * (float)bezier_basis0._2796_4_ + fVar83 * (float)bezier_basis0._3952_4_;
  fVar46 = fVar92 * (float)bezier_basis0._488_4_ +
           auVar26._12_4_ * (float)bezier_basis0._1644_4_ +
           auVar10._12_4_ * (float)bezier_basis0._2800_4_ + fVar84 * (float)bezier_basis0._3956_4_;
  fVar48 = fVar86 * (float)bezier_basis0._492_4_ +
           fVar104 * (float)bezier_basis0._1648_4_ +
           fVar93 * (float)bezier_basis0._2804_4_ + fVar80 * (float)bezier_basis0._3960_4_;
  fVar50 = fVar89 * (float)bezier_basis0._496_4_ +
           fVar108 * (float)bezier_basis0._1652_4_ +
           fVar96 * (float)bezier_basis0._2808_4_ + fVar82 * (float)bezier_basis0._3964_4_;
  fVar52 = fVar91 * (float)bezier_basis0._500_4_ +
           fVar110 * (float)bezier_basis0._1656_4_ +
           fVar98 * (float)bezier_basis0._2812_4_ + fVar83 * (float)bezier_basis0._3968_4_;
  fVar54 = fVar84 + 0.0 + 0.0 + 0.0;
  auVar67 = vshufps_avx(auVar38,auVar38,0xaa);
  fVar65 = auVar67._0_4_;
  fVar70 = auVar67._4_4_;
  fVar72 = auVar67._8_4_;
  fVar74 = auVar67._12_4_;
  auVar81._0_4_ =
       fVar65 * (float)bezier_basis0._476_4_ +
       fVar116 * (float)bezier_basis0._2788_4_ + fVar112 * (float)bezier_basis0._3944_4_ +
       fVar117 * (float)bezier_basis0._1632_4_;
  auVar81._4_4_ =
       fVar70 * (float)bezier_basis0._480_4_ +
       fVar119 * (float)bezier_basis0._2792_4_ + fVar113 * (float)bezier_basis0._3948_4_ +
       fVar120 * (float)bezier_basis0._1636_4_;
  auVar81._8_4_ =
       fVar72 * (float)bezier_basis0._484_4_ +
       fVar121 * (float)bezier_basis0._2796_4_ + fVar114 * (float)bezier_basis0._3952_4_ +
       fVar122 * (float)bezier_basis0._1640_4_;
  auVar81._12_4_ =
       fVar74 * (float)bezier_basis0._488_4_ +
       auVar24._12_4_ * (float)bezier_basis0._2800_4_ + fVar115 * (float)bezier_basis0._3956_4_ +
       fVar123 * (float)bezier_basis0._1644_4_;
  auVar81._16_4_ =
       fVar65 * (float)bezier_basis0._492_4_ +
       fVar116 * (float)bezier_basis0._2804_4_ + fVar112 * (float)bezier_basis0._3960_4_ +
       fVar117 * (float)bezier_basis0._1648_4_;
  auVar81._20_4_ =
       fVar70 * (float)bezier_basis0._496_4_ +
       fVar119 * (float)bezier_basis0._2808_4_ + fVar113 * (float)bezier_basis0._3964_4_ +
       fVar120 * (float)bezier_basis0._1652_4_;
  auVar81._24_4_ =
       fVar72 * (float)bezier_basis0._500_4_ +
       fVar121 * (float)bezier_basis0._2812_4_ + fVar114 * (float)bezier_basis0._3968_4_ +
       fVar122 * (float)bezier_basis0._1656_4_;
  auVar81._28_4_ = fStack_15c + 0.0;
  auVar67 = vpermilps_avx(auVar25,0);
  fVar59 = auVar67._0_4_;
  fVar61 = auVar67._4_4_;
  fVar62 = auVar67._8_4_;
  fVar63 = auVar67._12_4_;
  fVar23 = fVar124 * (float)bezier_basis0._1632_4_ +
           fVar85 * (float)bezier_basis0._2788_4_ + fVar129 * (float)bezier_basis0._3944_4_ +
           fVar59 * (float)bezier_basis0._476_4_;
  fVar29 = fVar126 * (float)bezier_basis0._1636_4_ +
           fVar88 * (float)bezier_basis0._2792_4_ + fVar130 * (float)bezier_basis0._3948_4_ +
           fVar61 * (float)bezier_basis0._480_4_;
  fVar30 = fVar127 * (float)bezier_basis0._1640_4_ +
           fVar90 * (float)bezier_basis0._2796_4_ + fVar131 * (float)bezier_basis0._3952_4_ +
           fVar62 * (float)bezier_basis0._484_4_;
  fVar31 = fVar128 * (float)bezier_basis0._1644_4_ +
           auVar55._12_4_ * (float)bezier_basis0._2800_4_ +
           auVar39._12_4_ * (float)bezier_basis0._3956_4_ + fVar63 * (float)bezier_basis0._488_4_;
  fVar32 = fVar124 * (float)bezier_basis0._1648_4_ +
           fVar85 * (float)bezier_basis0._2804_4_ + fVar129 * (float)bezier_basis0._3960_4_ +
           fVar59 * (float)bezier_basis0._492_4_;
  fVar33 = fVar126 * (float)bezier_basis0._1652_4_ +
           fVar88 * (float)bezier_basis0._2808_4_ + fVar130 * (float)bezier_basis0._3964_4_ +
           fVar61 * (float)bezier_basis0._496_4_;
  fVar34 = fVar127 * (float)bezier_basis0._1656_4_ +
           fVar90 * (float)bezier_basis0._2812_4_ + fVar131 * (float)bezier_basis0._3968_4_ +
           fVar62 * (float)bezier_basis0._500_4_;
  fVar35 = fVar102 + (float)bezier_basis0._504_4_;
  auVar40._0_4_ =
       fVar94 * (float)bezier_basis0._5100_4_ +
       (float)bezier_basis0._6256_4_ * fVar64 +
       (float)bezier_basis0._7412_4_ * fVar103 + (float)bezier_basis0._8568_4_ * fVar75;
  auVar40._4_4_ =
       fVar97 * (float)bezier_basis0._5104_4_ +
       (float)bezier_basis0._6260_4_ * fVar69 +
       (float)bezier_basis0._7416_4_ * fVar107 + (float)bezier_basis0._8572_4_ * fVar77;
  auVar40._8_4_ =
       fVar99 * (float)bezier_basis0._5108_4_ +
       (float)bezier_basis0._6264_4_ * fVar71 +
       (float)bezier_basis0._7420_4_ * fVar109 + (float)bezier_basis0._8576_4_ * fVar78;
  auVar40._12_4_ =
       fVar100 * (float)bezier_basis0._5112_4_ +
       (float)bezier_basis0._6268_4_ * fVar73 +
       (float)bezier_basis0._7424_4_ * fVar111 + (float)bezier_basis0._8580_4_ * fVar79;
  auVar40._16_4_ =
       fVar94 * (float)bezier_basis0._5116_4_ +
       (float)bezier_basis0._6272_4_ * fVar64 +
       (float)bezier_basis0._7428_4_ * fVar103 + (float)bezier_basis0._8584_4_ * fVar75;
  auVar40._20_4_ =
       fVar97 * (float)bezier_basis0._5120_4_ +
       (float)bezier_basis0._6276_4_ * fVar69 +
       (float)bezier_basis0._7432_4_ * fVar107 + (float)bezier_basis0._8588_4_ * fVar77;
  auVar40._24_4_ =
       fVar99 * (float)bezier_basis0._5124_4_ +
       (float)bezier_basis0._6280_4_ * fVar71 +
       (float)bezier_basis0._7436_4_ * fVar109 + (float)bezier_basis0._8592_4_ * fVar78;
  auVar40._28_4_ = fVar100 + (float)bezier_basis0._7440_4_ + fVar115 + 0.0;
  auVar95._0_4_ =
       fVar104 * (float)bezier_basis0._6256_4_ +
       (float)bezier_basis0._7412_4_ * fVar93 + (float)bezier_basis0._8568_4_ * fVar80 +
       (float)bezier_basis0._5100_4_ * fVar86;
  auVar95._4_4_ =
       fVar108 * (float)bezier_basis0._6260_4_ +
       (float)bezier_basis0._7416_4_ * fVar96 + (float)bezier_basis0._8572_4_ * fVar82 +
       (float)bezier_basis0._5104_4_ * fVar89;
  auVar95._8_4_ =
       fVar110 * (float)bezier_basis0._6264_4_ +
       (float)bezier_basis0._7420_4_ * fVar98 + (float)bezier_basis0._8576_4_ * fVar83 +
       (float)bezier_basis0._5108_4_ * fVar91;
  auVar95._12_4_ =
       auVar26._12_4_ * (float)bezier_basis0._6268_4_ +
       (float)bezier_basis0._7424_4_ * auVar10._12_4_ + (float)bezier_basis0._8580_4_ * fVar84 +
       (float)bezier_basis0._5112_4_ * fVar92;
  auVar95._16_4_ =
       fVar104 * (float)bezier_basis0._6272_4_ +
       (float)bezier_basis0._7428_4_ * fVar93 + (float)bezier_basis0._8584_4_ * fVar80 +
       (float)bezier_basis0._5116_4_ * fVar86;
  auVar95._20_4_ =
       fVar108 * (float)bezier_basis0._6276_4_ +
       (float)bezier_basis0._7432_4_ * fVar96 + (float)bezier_basis0._8588_4_ * fVar82 +
       (float)bezier_basis0._5120_4_ * fVar89;
  auVar95._24_4_ =
       fVar110 * (float)bezier_basis0._6280_4_ +
       (float)bezier_basis0._7436_4_ * fVar98 + (float)bezier_basis0._8592_4_ * fVar83 +
       (float)bezier_basis0._5124_4_ * fVar91;
  auVar95._28_4_ = (float)bezier_basis0._7440_4_ + fVar115 + fVar102 + fVar92;
  auVar56._0_4_ =
       (float)bezier_basis0._5100_4_ * fVar65 +
       fVar117 * (float)bezier_basis0._6256_4_ +
       (float)bezier_basis0._7412_4_ * fVar116 + fVar112 * (float)bezier_basis0._8568_4_;
  auVar56._4_4_ =
       (float)bezier_basis0._5104_4_ * fVar70 +
       fVar120 * (float)bezier_basis0._6260_4_ +
       (float)bezier_basis0._7416_4_ * fVar119 + fVar113 * (float)bezier_basis0._8572_4_;
  auVar56._8_4_ =
       (float)bezier_basis0._5108_4_ * fVar72 +
       fVar122 * (float)bezier_basis0._6264_4_ +
       (float)bezier_basis0._7420_4_ * fVar121 + fVar114 * (float)bezier_basis0._8576_4_;
  auVar56._12_4_ =
       (float)bezier_basis0._5112_4_ * fVar74 +
       fVar123 * (float)bezier_basis0._6268_4_ +
       (float)bezier_basis0._7424_4_ * auVar24._12_4_ + fVar115 * (float)bezier_basis0._8580_4_;
  auVar56._16_4_ =
       (float)bezier_basis0._5116_4_ * fVar65 +
       fVar117 * (float)bezier_basis0._6272_4_ +
       (float)bezier_basis0._7428_4_ * fVar116 + fVar112 * (float)bezier_basis0._8584_4_;
  auVar56._20_4_ =
       (float)bezier_basis0._5120_4_ * fVar70 +
       fVar120 * (float)bezier_basis0._6276_4_ +
       (float)bezier_basis0._7432_4_ * fVar119 + fVar113 * (float)bezier_basis0._8588_4_;
  auVar56._24_4_ =
       (float)bezier_basis0._5124_4_ * fVar72 +
       fVar122 * (float)bezier_basis0._6280_4_ +
       (float)bezier_basis0._7436_4_ * fVar121 + fVar114 * (float)bezier_basis0._8592_4_;
  auVar56._28_4_ = fVar74 + fVar123 + fVar115 + 0.0;
  auVar68._0_4_ =
       (float)bezier_basis0._5100_4_ * fVar59 +
       fVar124 * (float)bezier_basis0._6256_4_ +
       (float)bezier_basis0._7412_4_ * fVar85 + fVar129 * (float)bezier_basis0._8568_4_;
  auVar68._4_4_ =
       (float)bezier_basis0._5104_4_ * fVar61 +
       fVar126 * (float)bezier_basis0._6260_4_ +
       (float)bezier_basis0._7416_4_ * fVar88 + fVar130 * (float)bezier_basis0._8572_4_;
  auVar68._8_4_ =
       (float)bezier_basis0._5108_4_ * fVar62 +
       fVar127 * (float)bezier_basis0._6264_4_ +
       (float)bezier_basis0._7420_4_ * fVar90 + fVar131 * (float)bezier_basis0._8576_4_;
  auVar68._12_4_ =
       (float)bezier_basis0._5112_4_ * fVar63 +
       fVar128 * (float)bezier_basis0._6268_4_ +
       (float)bezier_basis0._7424_4_ * auVar55._12_4_ +
       auVar39._12_4_ * (float)bezier_basis0._8580_4_;
  auVar68._16_4_ =
       (float)bezier_basis0._5116_4_ * fVar59 +
       fVar124 * (float)bezier_basis0._6272_4_ +
       (float)bezier_basis0._7428_4_ * fVar85 + fVar129 * (float)bezier_basis0._8584_4_;
  auVar68._20_4_ =
       (float)bezier_basis0._5120_4_ * fVar61 +
       fVar126 * (float)bezier_basis0._6276_4_ +
       (float)bezier_basis0._7432_4_ * fVar88 + fVar130 * (float)bezier_basis0._8588_4_;
  auVar68._24_4_ =
       (float)bezier_basis0._5124_4_ * fVar62 +
       fVar127 * (float)bezier_basis0._6280_4_ +
       (float)bezier_basis0._7436_4_ * fVar90 + fVar131 * (float)bezier_basis0._8592_4_;
  auVar68._28_4_ = fVar63 + (float)bezier_basis0._6284_4_ + fVar115 + (float)bezier_basis0._8596_4_;
  auVar15 = ZEXT412(0);
  auVar7 = vblendps_avx(auVar40,ZEXT1232(auVar15) << 0x20,1);
  auVar8 = vblendps_avx(auVar95,ZEXT1232(auVar15) << 0x20,1);
  auVar57 = ZEXT1232(auVar15) << 0x20;
  auVar9 = vblendps_avx(auVar56,auVar57,1);
  auVar58 = vblendps_avx(auVar68,auVar57,1);
  auVar12._4_4_ = auVar7._4_4_ * 0.055555556;
  auVar12._0_4_ = auVar7._0_4_ * 0.055555556;
  auVar12._8_4_ = auVar7._8_4_ * 0.055555556;
  auVar12._12_4_ = auVar7._12_4_ * 0.055555556;
  auVar12._16_4_ = auVar7._16_4_ * 0.055555556;
  auVar12._20_4_ = auVar7._20_4_ * 0.055555556;
  auVar12._24_4_ = auVar7._24_4_ * 0.055555556;
  auVar12._28_4_ = auVar7._28_4_;
  auVar7._4_4_ = auVar8._4_4_ * 0.055555556;
  auVar7._0_4_ = auVar8._0_4_ * 0.055555556;
  auVar7._8_4_ = auVar8._8_4_ * 0.055555556;
  auVar7._12_4_ = auVar8._12_4_ * 0.055555556;
  auVar7._16_4_ = auVar8._16_4_ * 0.055555556;
  auVar7._20_4_ = auVar8._20_4_ * 0.055555556;
  auVar7._24_4_ = auVar8._24_4_ * 0.055555556;
  auVar7._28_4_ = auVar8._28_4_;
  auVar8._4_4_ = auVar9._4_4_ * 0.055555556;
  auVar8._0_4_ = auVar9._0_4_ * 0.055555556;
  auVar8._8_4_ = auVar9._8_4_ * 0.055555556;
  auVar8._12_4_ = auVar9._12_4_ * 0.055555556;
  auVar8._16_4_ = auVar9._16_4_ * 0.055555556;
  auVar8._20_4_ = auVar9._20_4_ * 0.055555556;
  auVar8._24_4_ = auVar9._24_4_ * 0.055555556;
  auVar8._28_4_ = fVar128;
  local_178._4_4_ = auVar58._4_4_ * 0.055555556;
  local_178._0_4_ = auVar58._0_4_ * 0.055555556;
  fStack_170 = auVar58._8_4_ * 0.055555556;
  fStack_16c = auVar58._12_4_ * 0.055555556;
  fStack_168 = auVar58._16_4_ * 0.055555556;
  fStack_164 = auVar58._20_4_ * 0.055555556;
  fStack_160 = auVar58._24_4_ * 0.055555556;
  auVar18._4_4_ = fVar41;
  auVar18._0_4_ = fVar36;
  auVar18._8_4_ = fVar43;
  auVar18._12_4_ = fVar45;
  auVar18._16_4_ = fVar47;
  auVar18._20_4_ = fVar49;
  auVar18._24_4_ = fVar51;
  auVar18._28_4_ = fVar53;
  auVar12 = vsubps_avx(auVar18,auVar12);
  auVar17._4_4_ = fVar42;
  auVar17._0_4_ = fVar37;
  auVar17._8_4_ = fVar44;
  auVar17._12_4_ = fVar46;
  auVar17._16_4_ = fVar48;
  auVar17._20_4_ = fVar50;
  auVar17._24_4_ = fVar52;
  auVar17._28_4_ = fVar54;
  auVar13 = vsubps_avx(auVar17,auVar7);
  auVar14 = vsubps_avx(auVar81,auVar8);
  auVar7 = vblendps_avx(auVar40,auVar57,0x80);
  auVar8 = vblendps_avx(auVar95,auVar57,0x80);
  auVar9 = vblendps_avx(auVar56,ZEXT1232(auVar15) << 0x20,0x80);
  auVar58 = vblendps_avx(auVar68,ZEXT1232(auVar15) << 0x20,0x80);
  auVar101._0_4_ = fVar36 + auVar7._0_4_ * 0.055555556;
  auVar101._4_4_ = fVar41 + auVar7._4_4_ * 0.055555556;
  auVar101._8_4_ = fVar43 + auVar7._8_4_ * 0.055555556;
  auVar101._12_4_ = fVar45 + auVar7._12_4_ * 0.055555556;
  auVar101._16_4_ = fVar47 + auVar7._16_4_ * 0.055555556;
  auVar101._20_4_ = fVar49 + auVar7._20_4_ * 0.055555556;
  auVar101._24_4_ = fVar51 + auVar7._24_4_ * 0.055555556;
  auVar101._28_4_ = fVar53 + auVar7._28_4_;
  auVar118._0_4_ = auVar8._0_4_ * 0.055555556 + fVar37;
  auVar118._4_4_ = auVar8._4_4_ * 0.055555556 + fVar42;
  auVar118._8_4_ = auVar8._8_4_ * 0.055555556 + fVar44;
  auVar118._12_4_ = auVar8._12_4_ * 0.055555556 + fVar46;
  auVar118._16_4_ = auVar8._16_4_ * 0.055555556 + fVar48;
  auVar118._20_4_ = auVar8._20_4_ * 0.055555556 + fVar50;
  auVar118._24_4_ = auVar8._24_4_ * 0.055555556 + fVar52;
  auVar118._28_4_ = auVar8._28_4_ + fVar54;
  auVar125._0_4_ = auVar81._0_4_ + auVar9._0_4_ * 0.055555556;
  auVar125._4_4_ = auVar81._4_4_ + auVar9._4_4_ * 0.055555556;
  auVar125._8_4_ = auVar81._8_4_ + auVar9._8_4_ * 0.055555556;
  auVar125._12_4_ = auVar81._12_4_ + auVar9._12_4_ * 0.055555556;
  auVar125._16_4_ = auVar81._16_4_ + auVar9._16_4_ * 0.055555556;
  auVar125._20_4_ = auVar81._20_4_ + auVar9._20_4_ * 0.055555556;
  auVar125._24_4_ = auVar81._24_4_ + auVar9._24_4_ * 0.055555556;
  auVar125._28_4_ = auVar81._28_4_ + auVar9._28_4_;
  auVar57._8_4_ = 0x7f800000;
  auVar57._0_8_ = 0x7f8000007f800000;
  auVar57._12_4_ = 0x7f800000;
  auVar57._16_4_ = 0x7f800000;
  auVar57._20_4_ = 0x7f800000;
  auVar57._24_4_ = 0x7f800000;
  auVar57._28_4_ = 0x7f800000;
  auVar7 = vminps_avx(auVar57,auVar18);
  auVar8 = vminps_avx(auVar57,auVar17);
  auVar9 = vminps_avx(auVar12,auVar101);
  auVar40 = vminps_avx(auVar7,auVar9);
  auVar7 = vminps_avx(auVar13,auVar118);
  auVar56 = vminps_avx(auVar8,auVar7);
  auVar7 = vminps_avx(auVar57,auVar81);
  auVar8 = vminps_avx(auVar14,auVar125);
  auVar68 = vminps_avx(auVar7,auVar8);
  auVar16._4_4_ = fVar29;
  auVar16._0_4_ = fVar23;
  auVar16._8_4_ = fVar30;
  auVar16._12_4_ = fVar31;
  auVar16._16_4_ = fVar32;
  auVar16._20_4_ = fVar33;
  auVar16._24_4_ = fVar34;
  auVar16._28_4_ = fVar35;
  auVar95 = vsubps_avx(auVar16,_local_178);
  auVar27._0_4_ = fVar23 + auVar58._0_4_ * 0.055555556;
  auVar27._4_4_ = fVar29 + auVar58._4_4_ * 0.055555556;
  auVar27._8_4_ = fVar30 + auVar58._8_4_ * 0.055555556;
  auVar27._12_4_ = fVar31 + auVar58._12_4_ * 0.055555556;
  auVar27._16_4_ = fVar32 + auVar58._16_4_ * 0.055555556;
  auVar27._20_4_ = fVar33 + auVar58._20_4_ * 0.055555556;
  auVar27._24_4_ = fVar34 + auVar58._24_4_ * 0.055555556;
  auVar27._28_4_ = fVar35 + auVar58._28_4_;
  auVar7 = vminps_avx(auVar57,auVar16);
  auVar8 = vminps_avx(auVar95,auVar27);
  auVar57 = vminps_avx(auVar7,auVar8);
  auVar58._8_4_ = 0xff800000;
  auVar58._0_8_ = 0xff800000ff800000;
  auVar58._12_4_ = 0xff800000;
  auVar58._16_4_ = 0xff800000;
  auVar58._20_4_ = 0xff800000;
  auVar58._24_4_ = 0xff800000;
  auVar58._28_4_ = 0xff800000;
  auVar7 = vmaxps_avx(auVar58,auVar18);
  auVar8 = vmaxps_avx(auVar58,auVar17);
  auVar9 = vmaxps_avx(auVar58,auVar81);
  auVar58 = vmaxps_avx(auVar58,auVar16);
  auVar12 = vmaxps_avx(auVar12,auVar101);
  auVar7 = vmaxps_avx(auVar7,auVar12);
  auVar12 = vmaxps_avx(auVar13,auVar118);
  auVar8 = vmaxps_avx(auVar8,auVar12);
  auVar12 = vmaxps_avx(auVar14,auVar125);
  auVar9 = vmaxps_avx(auVar9,auVar12);
  auVar12 = vmaxps_avx(auVar95,auVar27);
  auVar58 = vmaxps_avx(auVar58,auVar12);
  auVar12 = vshufps_avx(auVar40,auVar40,0xb1);
  auVar12 = vminps_avx(auVar40,auVar12);
  auVar40 = vshufpd_avx(auVar12,auVar12,5);
  auVar12 = vminps_avx(auVar12,auVar40);
  auVar55 = vminps_avx(auVar12._0_16_,auVar12._16_16_);
  auVar12 = vshufps_avx(auVar56,auVar56,0xb1);
  auVar12 = vminps_avx(auVar56,auVar12);
  auVar40 = vshufpd_avx(auVar12,auVar12,5);
  auVar12 = vminps_avx(auVar12,auVar40);
  auVar10 = vminps_avx(auVar12._0_16_,auVar12._16_16_);
  auVar10 = vunpcklps_avx(auVar55,auVar10);
  auVar12 = vshufps_avx(auVar68,auVar68,0xb1);
  auVar12 = vminps_avx(auVar68,auVar12);
  auVar40 = vshufpd_avx(auVar12,auVar12,5);
  auVar12 = vminps_avx(auVar12,auVar40);
  auVar55 = vminps_avx(auVar12._0_16_,auVar12._16_16_);
  auVar24 = vinsertps_avx(auVar10,auVar55,0x28);
  auVar12 = vshufps_avx(auVar7,auVar7,0xb1);
  auVar7 = vmaxps_avx(auVar7,auVar12);
  auVar12 = vshufpd_avx(auVar7,auVar7,5);
  auVar7 = vmaxps_avx(auVar7,auVar12);
  auVar55 = vmaxps_avx(auVar7._0_16_,auVar7._16_16_);
  auVar7 = vshufps_avx(auVar8,auVar8,0xb1);
  auVar7 = vmaxps_avx(auVar8,auVar7);
  auVar8 = vshufpd_avx(auVar7,auVar7,5);
  auVar7 = vmaxps_avx(auVar7,auVar8);
  auVar10 = vmaxps_avx(auVar7._0_16_,auVar7._16_16_);
  auVar10 = vunpcklps_avx(auVar55,auVar10);
  auVar7 = vshufps_avx(auVar9,auVar9,0xb1);
  auVar7 = vmaxps_avx(auVar9,auVar7);
  auVar8 = vshufpd_avx(auVar7,auVar7,5);
  auVar7 = vmaxps_avx(auVar7,auVar8);
  auVar55 = vmaxps_avx(auVar7._0_16_,auVar7._16_16_);
  auVar39 = vinsertps_avx(auVar10,auVar55,0x28);
  auVar7 = vshufps_avx(auVar57,auVar57,0xb1);
  auVar7 = vminps_avx(auVar57,auVar7);
  auVar8 = vshufpd_avx(auVar7,auVar7,5);
  auVar7 = vminps_avx(auVar7,auVar8);
  auVar55 = vminss_avx(auVar7._0_16_,auVar7._16_16_);
  auVar7 = vshufps_avx(auVar58,auVar58,0xb1);
  auVar7 = vmaxps_avx(auVar58,auVar7);
  auVar8 = vshufpd_avx(auVar7,auVar7,5);
  auVar7 = vmaxps_avx(auVar7,auVar8);
  auVar10 = vmaxss_avx(auVar7._0_16_,auVar7._16_16_);
  auVar67._8_4_ = 0x7fffffff;
  auVar67._0_8_ = 0x7fffffff7fffffff;
  auVar67._12_4_ = 0x7fffffff;
  auVar55 = vandps_avx(auVar55,auVar67);
  auVar10 = vandps_avx(auVar10,auVar67);
  auVar55 = vmaxss_avx(auVar10,auVar55);
  auVar55 = vshufps_avx(auVar55,auVar55,0);
  auVar24 = vsubps_avx(auVar24,auVar55);
  auVar26._0_4_ = auVar39._0_4_ + auVar55._0_4_;
  auVar26._4_4_ = auVar39._4_4_ + auVar55._4_4_;
  auVar26._8_4_ = auVar39._8_4_ + auVar55._8_4_;
  auVar26._12_4_ = auVar39._12_4_ + auVar55._12_4_;
  auVar55 = vandps_avx(auVar24,auVar67);
  auVar10 = vandps_avx(auVar26,auVar67);
  auVar55 = vmaxps_avx(auVar55,auVar10);
  auVar10 = vmovshdup_avx(auVar55);
  auVar10 = vmaxss_avx(auVar10,auVar55);
  auVar55 = vshufpd_avx(auVar55,auVar55,1);
  auVar55 = vmaxss_avx(auVar55,auVar10);
  auVar55 = ZEXT416((uint)(auVar55._0_4_ * 4.7683716e-07));
  auVar55 = vshufps_avx(auVar55,auVar55,0);
  aVar11 = (anon_union_16_2_47237d3f_for_Vec3fa_0)vsubps_avx(auVar24,auVar55);
  (__return_storage_ptr__->lower).field_0 = aVar11;
  (__return_storage_ptr__->upper).field_0.m128[0] = auVar26._0_4_ + auVar55._0_4_;
  (__return_storage_ptr__->upper).field_0.m128[1] = auVar26._4_4_ + auVar55._4_4_;
  (__return_storage_ptr__->upper).field_0.m128[2] = auVar26._8_4_ + auVar55._8_4_;
  (__return_storage_ptr__->upper).field_0.m128[3] = auVar26._12_4_ + auVar55._12_4_;
  return __return_storage_ptr__;
}

Assistant:

BBox3fa vbounds(const Vec3fa& ofs, const float scale, const float r_scale0, const LinearSpace3fa& space, size_t i, size_t itime = 0) const {
        return bounds(ofs,scale,r_scale0,space,i,itime);
      }